

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int decodeFlags(MemPage *pPage,int flagByte)

{
  BtShared *pBVar1;
  u8 uVar2;
  code *pcVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  
  uVar2 = (u8)((uint)flagByte >> 3);
  pPage->leaf = uVar2;
  pPage->childPtrSize = '\x04' - (char)(((uint)flagByte >> 3) << 2);
  pBVar1 = pPage->pBt;
  if ((flagByte & 0xfffffff7U) == 2) {
    pPage->intKey = '\0';
    lVar4 = 0x2c;
    lVar6 = 0x2a;
    pcVar5 = btreeParseCellPtrIndex;
    pcVar3 = cellSizePtr;
    bVar7 = false;
  }
  else {
    if ((flagByte & 0xfffffff7U) != 5) {
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10ccb,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      return 0xb;
    }
    pPage->intKey = '\x01';
    bVar7 = uVar2 != '\0';
    pcVar3 = cellSizePtrNoPayload;
    if (bVar7) {
      pcVar3 = cellSizePtrTableLeaf;
    }
    pcVar5 = btreeParseCellPtrNoPayload;
    if (bVar7) {
      pcVar5 = btreeParseCellPtr;
    }
    lVar4 = 0x30;
    lVar6 = 0x2e;
  }
  pPage->intKeyLeaf = bVar7;
  pPage->xCellSize = pcVar3;
  pPage->xParseCell = pcVar5;
  pPage->maxLocal = *(u16 *)((long)&pBVar1->pPager + lVar6);
  pPage->minLocal = *(u16 *)((long)&pBVar1->pPager + lVar4);
  pPage->max1bytePayload = pBVar1->max1bytePayload;
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->leaf = (u8)(flagByte>>3);  assert( PTF_LEAF == 1<<3 );
  flagByte &= ~PTF_LEAF;
  pPage->childPtrSize = 4-4*pPage->leaf;
  pBt = pPage->pBt;
  if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
    /* EVIDENCE-OF: R-07291-35328 A value of 5 (0x05) means the page is an
    ** interior table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY)==5 );
    /* EVIDENCE-OF: R-26900-09176 A value of 13 (0x0d) means the page is a
    ** leaf table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY|PTF_LEAF)==13 );
    pPage->intKey = 1;
    if( pPage->leaf ){
      pPage->intKeyLeaf = 1;
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
    }else{
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
    }
    pPage->maxLocal = pBt->maxLeaf;
    pPage->minLocal = pBt->minLeaf;
  }else if( flagByte==PTF_ZERODATA ){
    /* EVIDENCE-OF: R-43316-37308 A value of 2 (0x02) means the page is an
    ** interior index b-tree page. */
    assert( (PTF_ZERODATA)==2 );
    /* EVIDENCE-OF: R-59615-42828 A value of 10 (0x0a) means the page is a
    ** leaf index b-tree page. */
    assert( (PTF_ZERODATA|PTF_LEAF)==10 );
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->xCellSize = cellSizePtr;
    pPage->xParseCell = btreeParseCellPtrIndex;
    pPage->maxLocal = pBt->maxLocal;
    pPage->minLocal = pBt->minLocal;
  }else{
    /* EVIDENCE-OF: R-47608-56469 Any other value for the b-tree page type is
    ** an error. */
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->xCellSize = cellSizePtr;
    pPage->xParseCell = btreeParseCellPtrIndex;
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->max1bytePayload = pBt->max1bytePayload;
  return SQLITE_OK;
}